

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpIfnil::parse(CTcPrsOpIfnil *this)

{
  tc_toktyp_t tVar1;
  int iVar2;
  tc_constval_type_t tVar3;
  CTcPrsNode *pCVar4;
  undefined4 extraout_var;
  CTcPrsNode *second;
  CTcPrsNode *first;
  int in_stack_ffffffffffffffbc;
  CTcParser *in_stack_ffffffffffffffc0;
  CTcTokenizer *in_stack_ffffffffffffffc8;
  CTPNIfnil *in_stack_ffffffffffffffd0;
  CTcPrsOpBin *in_stack_ffffffffffffffd8;
  CTcPrsNode *local_8;
  
  local_8 = CTcPrsOpBin::parse(in_stack_ffffffffffffffd8);
  if (local_8 == (CTcPrsNode *)0x0) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2a778f);
    if (tVar1 == TOKT_QQ) {
      CTcTokenizer::next(in_stack_ffffffffffffffc8);
      pCVar4 = CTcParser::parse_expr_or_dstr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (pCVar4 == (CTcPrsNode *)0x0) {
        local_8 = (CTcPrsNode *)0x0;
      }
      else {
        iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a77e8);
        if (iVar2 == 0) {
          local_8 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2a7831);
          CTPNIfnil::CTPNIfnil
                    (in_stack_ffffffffffffffd0,(CTcPrsNode *)in_stack_ffffffffffffffc8,local_8);
        }
        else {
          iVar2 = (*(local_8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
          tVar3 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var,iVar2));
          if (tVar3 == TC_CVT_NIL) {
            local_8 = pCVar4;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpIfnil::parse() const
{
    /* parse the conditional part */
    CTcPrsNode *first = S_op_or.parse();
    if (first == 0)
        return 0;

    /* if we're not looking at the '??' operator, we're done */
    if (G_tok->cur() != TOKT_QQ)
        return first;

    /* skip the '??' operator */
    G_tok->next();

    /* 
     *   parse the second part, which can be any expression except ',', since
     *   we have higher precedence than ',' 
     */
    CTcPrsNode *second = G_prs->parse_expr_or_dstr(FALSE);
    if (second == 0)
        return 0;

    /* if the first expression is constant, we can fold immediately */
    if (first->is_const())
    {
        /* if it's nil, yield the second value, otherwise yield the first */
        return (first->get_const_val()->get_type() == TC_CVT_NIL
                ? second : first);
    }
    else
    {
        /* it's not a constant value - return a new if-nil node */
        return new CTPNIfnil(first, second);
    }
}